

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall FIX::double_conversion::Bignum::SubtractTimes(Bignum *this,Bignum *other,int factor)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  uint uVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  uVar4 = other->exponent_ - this->exponent_;
  if (other->exponent_ < this->exponent_) {
    __assert_fail("exponent_ <= other.exponent_",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x2e3,"void FIX::double_conversion::Bignum::SubtractTimes(const Bignum &, int)");
  }
  if (factor < 3) {
    if (0 < factor) {
      do {
        SubtractBignum(this,other);
        factor = factor + -1;
      } while (factor != 0);
    }
    return;
  }
  iVar6 = other->used_digits_;
  if (iVar6 < 1) {
    uVar7 = 0;
  }
  else {
    puVar5 = (this->bigits_).start_;
    puVar2 = (other->bigits_).start_;
    lVar9 = 0;
    uVar7 = 0;
    do {
      if ((((other->bigits_).length_ <= lVar9) || (iVar6 = uVar4 + (int)lVar9, iVar6 < 0)) ||
         ((this->bigits_).length_ <= iVar6)) goto LAB_0016cf44;
      uVar3 = (ulong)uVar7 + (ulong)puVar2[lVar9] * (ulong)(uint)factor;
      uVar7 = puVar5[(ulong)uVar4 + lVar9] - ((uint)uVar3 & 0xfffffff);
      puVar5[(ulong)uVar4 + lVar9] = uVar7 & 0xfffffff;
      uVar7 = (int)(uVar3 >> 0x1c) - ((int)uVar7 >> 0x1f);
      lVar9 = lVar9 + 1;
      iVar6 = other->used_digits_;
    } while (lVar9 < iVar6);
  }
  uVar4 = iVar6 + uVar4;
  if ((int)uVar4 < this->used_digits_) {
    puVar5 = (this->bigits_).start_ + uVar4;
    uVar8 = uVar4;
    do {
      if (uVar7 == 0) {
        return;
      }
      if (((int)uVar4 < 0) || ((this->bigits_).length_ <= (int)uVar8)) {
LAB_0016cf44:
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xcc,
                      "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                     );
      }
      uVar1 = *puVar5;
      *puVar5 = uVar1 - uVar7 & 0xfffffff;
      uVar7 = uVar1 - uVar7 >> 0x1f;
      uVar8 = uVar8 + 1;
      puVar5 = puVar5 + 1;
    } while ((int)uVar8 < this->used_digits_);
  }
  Clamp(this);
  return;
}

Assistant:

void Bignum::SubtractTimes(const Bignum& other, int factor) {
  ASSERT(exponent_ <= other.exponent_);
  if (factor < 3) {
    for (int i = 0; i < factor; ++i) {
      SubtractBignum(other);
    }
    return;
  }
  Chunk borrow = 0;
  int exponent_diff = other.exponent_ - exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * other.bigits_[i];
    DoubleChunk remove = borrow + product;
    Chunk difference = bigits_[i + exponent_diff] - (remove & kBigitMask);
    bigits_[i + exponent_diff] = difference & kBigitMask;
    borrow = static_cast<Chunk>((difference >> (kChunkSize - 1)) +
                                (remove >> kBigitSize));
  }
  for (int i = other.used_digits_ + exponent_diff; i < used_digits_; ++i) {
    if (borrow == 0) return;
    Chunk difference = bigits_[i] - borrow;
    bigits_[i] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  Clamp();
}